

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

size_t __thiscall Darts::Details::Keyset<int>::lengths(Keyset<int> *this,size_t id)

{
  bool bVar1;
  Keyset<int> *local_28;
  size_t length;
  size_t id_local;
  Keyset<int> *this_local;
  
  bVar1 = has_lengths(this);
  if (bVar1) {
    this_local = (Keyset<int> *)this->lengths_[id];
  }
  else {
    for (local_28 = (Keyset<int> *)0x0; this->keys_[id][(long)local_28] != '\0';
        local_28 = (Keyset<int> *)((long)&local_28->num_keys_ + 1)) {
    }
    this_local = local_28;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t lengths(std::size_t id) const {
    if (has_lengths()) {
      return lengths_[id];
    }
    std::size_t length = 0;
    while (keys_[id][length] != '\0') {
      ++length;
    }
    return length;
  }